

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall Blip_Buffer::remove_samples(Blip_Buffer *this,long count)

{
  long lVar1;
  Blip_Buffer *in_RSI;
  Blip_Buffer *in_RDI;
  long remain;
  int copy_extra;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (in_RDI->buffer_ == (buf_t_ *)0x0) {
    __assert_fail("( \"unmet requirement\", buffer_ )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Buffer.cpp"
                  ,0x139,"void Blip_Buffer::remove_samples(long)");
  }
  if (in_RSI != (Blip_Buffer *)0x0) {
    remove_silence(in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    lVar1 = samples_avail(in_RDI);
    lVar1 = lVar1 + 0x19;
    if ((long)in_RSI < lVar1) {
      memcpy(in_RDI->buffer_,in_RDI->buffer_ + (long)in_RSI,lVar1 * 2);
    }
    else {
      memmove(in_RDI->buffer_,in_RDI->buffer_ + (long)in_RSI,lVar1 * 2);
    }
    memset(in_RDI->buffer_ + lVar1,0x7f,(long)in_RSI << 1);
  }
  return;
}

Assistant:

void Blip_Buffer::remove_samples( long count )
{
	require( buffer_ ); // sample rate must have been set
	
	if ( !count ) // optimization
		return;
	
	remove_silence( count );
	
	// Allows synthesis slightly past time passed to end_frame(), as long as it's
	// not more than an output sample.
	// to do: kind of hacky, could add run_until() which keeps track of extra synthesis
	int const copy_extra = 1;
	
	// copy remaining samples to beginning and clear old samples
	long remain = samples_avail() + widest_impulse_ + copy_extra;
	if ( count >= remain )
		memmove( buffer_, buffer_ + count, remain * sizeof (buf_t_) );
	else
		memcpy(  buffer_, buffer_ + count, remain * sizeof (buf_t_) );
	memset( buffer_ + remain, sample_offset & 0xFF, count * sizeof (buf_t_) );
}